

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  long lVar1;
  uint uVar2;
  u32 uVar3;
  int iVar4;
  u8 *p;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  bool bVar5;
  DbPage *pDbPage;
  int a_1;
  Pgno *aNew;
  int nOvfl;
  Pgno nextPage;
  u32 ovflSize;
  int a;
  int iPage;
  BtShared *pBt;
  MemPage *pPage;
  int iIdx;
  int rc;
  uchar *aPayload;
  int in_stack_ffffffffffffff7c;
  MemPage *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  Pgno in_stack_ffffffffffffffb4;
  Pager *pPager;
  BtShared *pBt_00;
  uint local_38;
  int local_34;
  int local_18;
  uint local_14;
  int local_4;
  
  local_34 = 0;
  local_38 = 0;
  pBt_00 = *(BtShared **)(in_RDI + 0xa0 + (long)*(short *)(in_RDI + 0x70) * 8);
  pPager = *(Pager **)(in_RDI + 8);
  if (*(short *)(in_RDI + 0x48) == 0) {
    in_stack_ffffffffffffffb4 = (Pgno)*(short *)(in_RDI + 0x70);
    btreeParseCell(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(CellInfo *)0x1369d2);
    *(byte *)(in_RDI + 0x6c) = *(byte *)(in_RDI + 0x6c) | 2;
  }
  lVar1 = *(long *)(in_RDI + 0x38);
  if ((pBt_00->mutex->mutex).__size + pPager->cksumInit <
      (char *)(lVar1 + (ulong)*(ushort *)(in_RDI + 0x44))) {
    local_4 = sqlite3CorruptError(0);
  }
  else {
    if (in_ESI < *(ushort *)(in_RDI + 0x44)) {
      in_stack_ffffffffffffffb0 = in_EDX;
      if ((uint)*(ushort *)(in_RDI + 0x44) < in_EDX + in_ESI) {
        in_stack_ffffffffffffffb0 = *(ushort *)(in_RDI + 0x44) - in_ESI;
      }
      local_34 = copyPayload(in_stack_ffffffffffffff98,
                             (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                             (DbPage *)in_stack_ffffffffffffff80);
      local_14 = 0;
      local_18 = in_EDX - in_stack_ffffffffffffffb0;
    }
    else {
      local_14 = in_ESI - *(ushort *)(in_RDI + 0x44);
      local_18 = in_EDX;
    }
    if ((local_34 == 0) && (local_18 != 0)) {
      uVar2 = pPager->cksumInit - 4;
      uVar3 = sqlite3Get4byte((u8 *)(lVar1 + (ulong)*(ushort *)(in_RDI + 0x44)));
      if ((in_R8D != 2) && ((*(byte *)(in_RDI + 0x6c) & 4) == 0)) {
        in_stack_ffffffffffffffa4 =
             (((*(int *)(in_RDI + 0x40) - (uint)*(ushort *)(in_RDI + 0x44)) + uVar2) - 1) / uVar2;
        if (*(int *)(in_RDI + 100) < (int)in_stack_ffffffffffffffa4) {
          in_stack_ffffffffffffff98 =
               sqlite3Realloc(in_stack_ffffffffffffff98,
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          if (in_stack_ffffffffffffff98 == (void *)0x0) {
            local_34 = 7;
          }
          else {
            *(uint *)(in_RDI + 100) = in_stack_ffffffffffffffa4 << 1;
            *(void **)(in_RDI + 0x28) = in_stack_ffffffffffffff98;
          }
        }
        if (local_34 == 0) {
          memset(*(void **)(in_RDI + 0x28),0,(long)(int)in_stack_ffffffffffffffa4 << 2);
          *(byte *)(in_RDI + 0x6c) = *(byte *)(in_RDI + 0x6c) | 4;
        }
      }
      if (((*(byte *)(in_RDI + 0x6c) & 4) != 0) &&
         (in_stack_ffffffffffffff80 = *(MemPage **)(in_RDI + 0x28),
         *(int *)(in_stack_ffffffffffffff80->aiOvfl + ((ulong)local_14 / (ulong)uVar2) * 2 + -0xb)
         != 0)) {
        local_38 = local_14 / uVar2;
        uVar3 = *(u32 *)(*(long *)(in_RDI + 0x28) + (long)(int)local_38 * 4);
        local_14 = local_14 % uVar2;
      }
      while( true ) {
        bVar5 = false;
        if ((local_34 == 0) && (bVar5 = false, local_18 != 0)) {
          bVar5 = uVar3 != 0;
        }
        if (!bVar5) break;
        if ((*(byte *)(in_RDI + 0x6c) & 4) != 0) {
          *(u32 *)(*(long *)(in_RDI + 0x28) + (long)(int)local_38 * 4) = uVar3;
        }
        if (local_14 < uVar2) {
          iVar4 = local_18;
          if (uVar2 < local_18 + local_14) {
            iVar4 = uVar2 - local_14;
          }
          local_34 = sqlite3PagerAcquire(pPager,in_stack_ffffffffffffffb4,
                                         (DbPage **)CONCAT44(uVar2,uVar3),in_stack_ffffffffffffffa4)
          ;
          if (local_34 == 0) {
            p = (u8 *)sqlite3PagerGetData((DbPage *)
                                          CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
            uVar3 = sqlite3Get4byte(p);
            local_34 = copyPayload(in_stack_ffffffffffffff98,
                                   (void *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                                   (DbPage *)in_stack_ffffffffffffff80);
            sqlite3PagerUnref((DbPage *)0x136dd3);
            local_14 = 0;
          }
          local_18 = local_18 - iVar4;
        }
        else {
          if (*(int *)(*(long *)(in_RDI + 0x28) + (long)(int)(local_38 + 1) * 4) == 0) {
            local_34 = getOverflowPage(pBt_00,(Pgno)((ulong)pPager >> 0x20),
                                       (MemPage **)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                       ,(Pgno *)CONCAT44(uVar2,uVar3));
          }
          else {
            uVar3 = *(u32 *)(*(long *)(in_RDI + 0x28) + (long)(int)(local_38 + 1) * 4);
          }
          local_14 = local_14 - uVar2;
        }
        local_38 = local_38 + 1;
      }
    }
    if ((local_34 == 0) && (local_18 != 0)) {
      local_4 = sqlite3CorruptError(0);
    }
    else {
      local_4 = local_34;
    }
  }
  return local_4;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;
  int bEnd;                                 /* True if reading to end of data */
#endif

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );
  assert( eOp!=2 || offset==0 );    /* Always start from beginning for eOp==2 */

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  bEnd = offset+amt==pCur->info.nPayload;
#endif
  assert( offset+amt <= pCur->info.nPayload );

  if( &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize] ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, (eOp & 0x01), pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    ** Except, do not allocate aOverflow[] for eOp==2.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( eOp!=2 && (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( nOvfl>pCur->nOvflAlloc ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
        }else{
          pCur->nOvflAlloc = nOvfl*2;
          pCur->aOverflow = aNew;
        }
      }
      if( rc==SQLITE_OK ){
        memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
        pCur->curFlags |= BTCF_ValidOvfl;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)!=0
     && pCur->aOverflow[offset/ovflSize]
    ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

      /* If required, populate the overflow page-list cache. */
      if( (pCur->curFlags & BTCF_ValidOvfl)!=0 ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        **
        ** Note that the aOverflow[] array must be allocated because eOp!=2
        ** here.  If eOp==2, then offset==0 and this branch is never taken.
        */
        assert( eOp!=2 );
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **   6) all data from the page is being read.
        **   7) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( (eOp&0x01)==0                                      /* (1) */
         && offset==0                                          /* (2) */
         && (bEnd || a==ovflSize)                              /* (6) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
         && &pBuf[-4]>=pBufStart                               /* (7) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* hence (7) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              ((eOp&0x01)==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, (eOp&0x01), pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}